

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_DenseMatvec(SUNDlsMat A,realtype *x,realtype *y)

{
  realtype *in_RDX;
  realtype *in_RSI;
  long in_RDI;
  
  SUNDlsMat_denseMatvec
            (*(realtype ***)(in_RDI + 0x30),in_RSI,in_RDX,*(sunindextype *)(in_RDI + 4),
             *(sunindextype *)(in_RDI + 8));
  return;
}

Assistant:

void SUNDlsMat_DenseMatvec(SUNDlsMat A, realtype *x, realtype *y)
{
  SUNDlsMat_denseMatvec(A->cols, x, y, A->M, A->N);
}